

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImGuiContextHook *pIVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *window;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ImDrawList *pIVar10;
  int iVar11;
  char *__function;
  int iVar12;
  ImDrawList **ppIVar13;
  ImGuiContext *g;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ImGuiWindow *pIVar18;
  long lVar19;
  ImGuiWindow *pIVar20;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1178,"void ImGui::Render()");
  }
  iVar8 = GImGui->FrameCountEnded;
  if (iVar8 != GImGui->FrameCount) {
    EndFrame();
    iVar8 = pIVar5->FrameCount;
  }
  pIVar5->FrameCountRendered = iVar8;
  (pIVar5->IO).MetricsRenderWindows = 0;
  iVar8 = (pIVar5->Hooks).Size;
  if (0 < iVar8) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar2 = (pIVar5->Hooks).Data;
      if (*(int *)(pIVar2 + lVar17 + 4) == 4) {
        (**(code **)(pIVar2 + lVar17 + 0x10))(pIVar5);
        iVar8 = (pIVar5->Hooks).Size;
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar19 < iVar8);
  }
  uVar9 = (pIVar5->Viewports).Size;
  uVar15 = (ulong)uVar9;
  if (uVar9 != 0) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar15 <= (long)uVar16) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_0011bfd4;
      }
      pIVar3 = (pIVar5->Viewports).Data[uVar16];
      ImDrawDataBuilder::Clear(&pIVar3->DrawDataBuilder);
      if (pIVar3->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar3,0,"##Background");
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar10);
      }
      uVar16 = uVar16 + 1;
      uVar15 = (ulong)(uint)(pIVar5->Viewports).Size;
    } while (uVar16 != uVar15);
  }
  pIVar18 = pIVar5->NavWindowingTarget;
  if (pIVar18 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
    pIVar20 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar18->Flags & 0x2000) == 0) {
      pIVar18 = pIVar18->RootWindow;
    }
    else {
      pIVar18 = (ImGuiWindow *)0x0;
    }
    pIVar20 = pIVar5->NavWindowingListWindow;
  }
  uVar9 = (pIVar5->Windows).Size;
  if (uVar9 != 0) {
    uVar15 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar15) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_0011bfd4:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,__function);
      }
      window = (pIVar5->Windows).Data[uVar15];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar20 && window != pIVar18) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        uVar9 = (pIVar5->Windows).Size;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar9);
  }
  bVar7 = true;
  do {
    bVar14 = bVar7;
    if (((pIVar18 != (ImGuiWindow *)0x0) && (pIVar18->Active == true)) && (pIVar18->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar18,(uint)pIVar18->Flags >> 0x19 & 1);
    }
    pIVar18 = pIVar20;
    bVar7 = false;
  } while (bVar14);
  (pIVar5->IO).MetricsRenderVertices = 0;
  (pIVar5->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar5->Viewports).Size) {
    lVar17 = 0;
    do {
      pIVar3 = (pIVar5->Viewports).Data[lVar17];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar3->DrawDataBuilder);
      if ((pIVar5->IO).MouseDrawCursor == true) {
        pIVar10 = GetViewportDrawList(pIVar3,1,"##Foreground");
        RenderMouseCursor(pIVar10,(pIVar5->IO).MousePos,(pIVar5->Style).MouseCursorScale,
                          pIVar5->MouseCursor,0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar3->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList(pIVar3,1,"##Foreground");
        AddDrawListToDrawData((pIVar3->DrawDataBuilder).Layers,pIVar10);
      }
      pIVar6 = GImGui;
      if (GImGui == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0xd78,"ImGuiIO &ImGui::GetIO()");
      }
      (pIVar3->DrawDataP).Valid = true;
      iVar8 = (pIVar3->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar8 < 1) {
        ppIVar13 = (ImDrawList **)0x0;
      }
      else {
        ppIVar13 = (pIVar3->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar3->DrawDataP).CmdLists = ppIVar13;
      (pIVar3->DrawDataP).CmdListsCount = iVar8;
      (pIVar3->DrawDataP).TotalIdxCount = 0;
      (pIVar3->DrawDataP).TotalVtxCount = 0;
      IVar4 = (pIVar3->super_ImGuiViewport).Size;
      (pIVar3->DrawDataP).DisplayPos = (pIVar3->super_ImGuiViewport).Pos;
      (pIVar3->DrawDataP).DisplaySize = IVar4;
      (pIVar3->DrawDataP).FramebufferScale = (pIVar6->IO).DisplayFramebufferScale;
      if (iVar8 < 1) {
        iVar11 = 0;
        iVar12 = 0;
      }
      else {
        lVar19 = 0;
        iVar11 = 0;
        iVar12 = 0;
        do {
          pIVar10 = (pIVar3->DrawDataBuilder).Layers[0].Data[lVar19];
          iVar12 = iVar12 + (pIVar10->VtxBuffer).Size;
          iVar11 = iVar11 + (pIVar10->IdxBuffer).Size;
          lVar19 = lVar19 + 1;
        } while (iVar8 != lVar19);
        (pIVar3->DrawDataP).TotalVtxCount = iVar12;
        (pIVar3->DrawDataP).TotalIdxCount = iVar11;
      }
      piVar1 = &(pIVar5->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar12;
      piVar1 = &(pIVar5->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pIVar5->Viewports).Size);
  }
  iVar8 = (pIVar5->Hooks).Size;
  if (0 < iVar8) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar2 = (pIVar5->Hooks).Data;
      if (*(int *)(pIVar2 + lVar17 + 4) == 5) {
        (**(code **)(pIVar2 + lVar17 + 0x10))(pIVar5,pIVar2 + lVar17);
        iVar8 = (pIVar5->Hooks).Size;
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar19 < iVar8);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}